

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

void __thiscall google::protobuf::Field::InternalSwap(Field *this,Field *other)

{
  InternalMetadata *this_00;
  bool bVar1;
  void *pvVar2;
  int iVar3;
  int32 iVar4;
  int32 iVar5;
  int iVar6;
  int iVar7;
  int32 iVar8;
  int32 iVar9;
  ulong uVar10;
  string *psVar11;
  UnknownFieldSet *other_00;
  Arena *arena;
  Arena *pAVar12;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pvVar2 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    if (((ulong)pvVar2 & 1) == 0) goto LAB_0031c266;
LAB_0031c255:
    other_00 = (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
  }
  else {
    if (((ulong)pvVar2 & 1) != 0) goto LAB_0031c255;
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
  }
  internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>(this_00,other_00);
LAB_0031c266:
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->options_).super_RepeatedPtrFieldBase,
             &(other->options_).super_RepeatedPtrFieldBase);
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar10 = (ulong)arena & 1;
  pAVar12 = arena;
  if (uVar10 != 0) {
    pAVar12 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->name_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->name_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar11 = internal::ArenaStringPtr::Mutable
                        (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                         pAVar12);
    internal::ArenaStringPtr::Mutable
              (&other->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar12);
    std::__cxx11::string::swap((string *)psVar11);
    arena = (Arena *)this_00->ptr_;
    uVar10 = (ulong)((uint)arena & 1);
  }
  pAVar12 = arena;
  if (uVar10 != 0) {
    pAVar12 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->type_url_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->type_url_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar11 = internal::ArenaStringPtr::Mutable
                        (&this->type_url_,(string *)&internal::fixed_address_empty_string_abi_cxx11_
                         ,pAVar12);
    internal::ArenaStringPtr::Mutable
              (&other->type_url_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar12)
    ;
    std::__cxx11::string::swap((string *)psVar11);
    arena = (Arena *)this_00->ptr_;
    uVar10 = (ulong)((uint)arena & 1);
  }
  pAVar12 = arena;
  if (uVar10 != 0) {
    pAVar12 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->json_name_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->json_name_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar11 = internal::ArenaStringPtr::Mutable
                        (&this->json_name_,
                         (string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar12);
    internal::ArenaStringPtr::Mutable
              (&other->json_name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar12
              );
    std::__cxx11::string::swap((string *)psVar11);
    arena = (Arena *)this_00->ptr_;
    uVar10 = (ulong)((uint)arena & 1);
  }
  if (uVar10 != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->default_value_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->default_value_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar11 = internal::ArenaStringPtr::Mutable
                        (&this->default_value_,
                         (string *)&internal::fixed_address_empty_string_abi_cxx11_,arena);
    internal::ArenaStringPtr::Mutable
              (&other->default_value_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               arena);
    std::__cxx11::string::swap((string *)psVar11);
  }
  iVar6 = this->kind_;
  iVar7 = this->cardinality_;
  iVar8 = this->number_;
  iVar9 = this->oneof_index_;
  iVar3 = other->cardinality_;
  iVar4 = other->number_;
  iVar5 = other->oneof_index_;
  this->kind_ = other->kind_;
  this->cardinality_ = iVar3;
  this->number_ = iVar4;
  this->oneof_index_ = iVar5;
  other->kind_ = iVar6;
  other->cardinality_ = iVar7;
  other->number_ = iVar8;
  other->oneof_index_ = iVar9;
  bVar1 = this->packed_;
  this->packed_ = other->packed_;
  other->packed_ = bVar1;
  return;
}

Assistant:

void Field::InternalSwap(Field* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  options_.InternalSwap(&other->options_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  type_url_.Swap(&other->type_url_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  json_name_.Swap(&other->json_name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  default_value_.Swap(&other->default_value_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(Field, packed_)
      + sizeof(Field::packed_)
      - PROTOBUF_FIELD_OFFSET(Field, kind_)>(
          reinterpret_cast<char*>(&kind_),
          reinterpret_cast<char*>(&other->kind_));
}